

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlutils.cpp
# Opt level: O1

bool __thiscall QXmlUtils::isPublicID(QXmlUtils *this,QStringView candidate)

{
  ushort uVar1;
  long lVar2;
  bool bVar3;
  
  bVar3 = this == (QXmlUtils *)0x0;
  if (!bVar3) {
    lVar2 = 0;
    do {
      uVar1 = *(ushort *)(candidate.m_size + lVar2);
      if ((((9 < uVar1 - 0x30) && (0x19 < (uVar1 & 0xffffffdf) - 0x41)) &&
          ((0x36 < uVar1 - 10 || ((0x6b003feec00009U >> ((ulong)(uVar1 - 10) & 0x3f) & 1) == 0))))
         && (uVar1 != 0x5f)) {
        return bVar3;
      }
      lVar2 = lVar2 + 2;
      bVar3 = (long)this * 2 == lVar2;
    } while (!bVar3);
  }
  return bVar3;
}

Assistant:

bool QXmlUtils::isPublicID(QStringView candidate)
{
    for (QChar ch : candidate) {
        const ushort cp = ch.unicode();

        if (isAsciiLetterOrNumber(cp))
            continue;

        switch (cp)
        {
            /* Fallthrough all these. */
            case 0x20:
            case 0x0D:
            case 0x0A:
            case '-':
            case '\'':
            case '(':
            case ')':
            case '+':
            case ',':
            case '.':
            case '/':
            case ':':
            case '=':
            case '?':
            case ';':
            case '!':
            case '*':
            case '#':
            case '@':
            case '$':
            case '_':
            case '%':
                continue;
            default:
                return false;
        }
    }

    return true;
}